

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_clock_linux.c
# Opt level: O2

int os_clock_linux_gettime64(uint64_t *t64)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  timespec ts;
  timespec local_18;
  
  if (_clock_source == 0) {
    iVar1 = gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
    if (iVar1 != 0) {
      return iVar1;
    }
    lVar2 = os_clock_linux_gettime64::offset + local_18.tv_sec;
    if (os_clock_linux_gettime64::last_sec == 0) {
      os_clock_linux_gettime64::last_sec = lVar2;
    }
    if (os_clock_linux_gettime64::last_sec + 0x3c < lVar2 ||
        lVar2 < os_clock_linux_gettime64::last_sec) {
      os_clock_linux_gettime64::offset = os_clock_linux_gettime64::last_sec - local_18.tv_sec;
      lVar2 = os_clock_linux_gettime64::last_sec;
    }
    uVar3 = 1000;
    os_clock_linux_gettime64::last_sec = lVar2;
  }
  else {
    iVar1 = clock_gettime(_clock_source,&local_18);
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar3 = 1000000;
    lVar2 = local_18.tv_sec;
  }
  *t64 = (ulong)local_18.tv_nsec / uVar3 + lVar2 * 1000;
  return 0;
}

Assistant:

int
os_clock_linux_gettime64(uint64_t *t64) {
  static time_t offset = 0, last_sec = 0;
  struct timeval tv;
  int error;

#if defined(CLOCK_MONOTONIC_RAW) || defined(CLOCK_MONOTONIC)
  if (_clock_source) {
    struct timespec ts;

    if ((error = clock_gettime(_clock_source, &ts)) != 0) {
      return error;
    }

    *t64 = 1000ull * ts.tv_sec + ts.tv_nsec / 1000000ull;
    return 0;
  }
#endif
  if ((error = gettimeofday(&tv, NULL)) != 0) {
    return error;
  }

  tv.tv_sec += offset;
  if (last_sec == 0) {
    last_sec = tv.tv_sec;
  }
  if (tv.tv_sec < last_sec || tv.tv_sec > last_sec + 60) {
    offset += last_sec - tv.tv_sec;
    tv.tv_sec = last_sec;
  }
  last_sec = tv.tv_sec;

  *t64 = 1000ull * tv.tv_sec + tv.tv_usec / 1000ull;
  return 0;
}